

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_medium_Test::TestBody
          (ByteBufferTest_test_read_write_medium_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e0;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  ByteBuffer byte_buffer2;
  int local_84;
  int32_t medium2;
  Message local_78;
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  ByteBuffer local_48 [8];
  ByteBuffer byte_buffer1;
  int local_14;
  ByteBufferTest_test_read_write_medium_Test *pBStack_10;
  int32_t medium1;
  ByteBufferTest_test_read_write_medium_Test *this_local;
  
  local_14 = 0xfff0e;
  pBStack_10 = this;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_48,2);
  bidfx_public_api::tools::ByteBuffer::WriteMedium((int)local_48);
  local_6c = bidfx_public_api::tools::ByteBuffer::ReadMedium();
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_68,"medium1","byte_buffer1.ReadMedium()",&local_14,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff80,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_84 = -0xfff0e;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)&gtest_ar_1.message_,2);
  bidfx_public_api::tools::ByteBuffer::WriteMedium((int)&gtest_ar_1 + 8);
  local_cc = bidfx_public_api::tools::ByteBuffer::ReadMedium();
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_c8,"medium2","byte_buffer2.ReadMedium()",&local_84,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar_1.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_48);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_medium)
{
    int32_t medium1 = 1048334;
    ByteBuffer byte_buffer1(2);
    byte_buffer1.WriteMedium(medium1);
    EXPECT_EQ(medium1, byte_buffer1.ReadMedium());

    int32_t medium2 = -1048334;
    ByteBuffer byte_buffer2(2);
    byte_buffer2.WriteMedium(medium2);
    EXPECT_EQ(medium2, byte_buffer2.ReadMedium());
}